

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_freeCCtxParams(ZSTD_CCtx_params *params)

{
  ZSTD_customMem customMem;
  long in_RDI;
  void *unaff_retaddr;
  undefined8 in_stack_fffffffffffffff8;
  
  if (in_RDI != 0) {
    customMem.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffff8;
    customMem.customAlloc = (ZSTD_allocFunction)in_RDI;
    customMem.opaque = unaff_retaddr;
    ZSTD_customFree(*(void **)(in_RDI + 0xa0),customMem);
  }
  return 0;
}

Assistant:

size_t ZSTD_freeCCtxParams(ZSTD_CCtx_params* params)
{
    if (params == NULL) { return 0; }
    ZSTD_customFree(params, params->customMem);
    return 0;
}